

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  byte *pbVar1;
  ptls_key_exchange_context_t **pppVar2;
  ushort *puVar3;
  char cVar4;
  uint16_t uVar5;
  ushort uVar6;
  st_ptls_get_time_t *psVar7;
  ptls_key_schedule_t *ppVar8;
  st_ptls_decompress_certificate_t *psVar9;
  ptls_cipher_suite_t *ppVar10;
  ptls_key_exchange_context_t *ppVar11;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar12;
  st_ptls_on_extension_t *psVar13;
  st_ptls_update_traffic_key_t *psVar14;
  ptls_buffer_t *buf;
  size_t sVar15;
  st_ptls_save_ticket_t *psVar16;
  ptls_iovec_t pVar17;
  void *pvVar18;
  undefined1 auVar19 [16];
  ptls_raw_extension_t *ppVar20;
  byte bVar21;
  ushort uVar22;
  int iVar23;
  int iVar24;
  uint64_t uVar25;
  ushort *src;
  uint8_t *puVar26;
  uint8_t *puVar27;
  undefined1 *puVar28;
  short sVar29;
  uint uVar30;
  uint uVar31;
  ptls_key_exchange_algorithm_t **pppVar32;
  ushort *puVar33;
  long lVar34;
  ptls_message_emitter_t *emitter_00;
  ulong uVar35;
  ptls_raw_extension_t *ppVar36;
  uint8_t *puVar37;
  size_t sVar38;
  char *pcVar39;
  ushort *puVar40;
  uint uVar41;
  ptls_raw_extension_t *ppVar42;
  ptls_message_emitter_t *ppVar43;
  ptls_cipher_suite_t **pppVar44;
  long lVar45;
  ptls_raw_extension_t *ppVar46;
  ushort uVar47;
  size_t sVar48;
  ushort *puVar49;
  uint8_t *puVar50;
  ptls_hash_context_t **pppVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ptls_iovec_t pVar57;
  ptls_iovec_t pVar58;
  ptls_iovec_t context;
  ptls_iovec_t pVar59;
  ptls_iovec_t pVar60;
  ptls_iovec_t pVar61;
  ptls_iovec_t pVar62;
  ptls_iovec_t pVar63;
  uint32_t ticket_lifetime;
  ptls_iovec_t ticket_nonce;
  st_ptls_server_hello_t sh;
  uint32_t ticket_age_add;
  uint32_t max_early_data_size;
  ptls_raw_extension_t *local_c8;
  uint local_bc;
  ptls_raw_extension_t *local_b8;
  ptls_raw_extension_t *local_b0;
  ptls_iovec_t local_a8;
  ptls_buffer_t local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  undefined1 auStack_60 [8];
  ptls_iovec_t local_58;
  undefined8 local_48;
  uint32_t local_40 [3];
  uint32_t local_34;
  
  puVar27 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar30 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar30) {
switchD_0010de14_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x11da,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar4 = *(char *)&emitter_00->buf;
  pVar62.len = (long)&switchD_0010de14::switchdataD_00138a30 +
               (long)(int)(&switchD_0010de14::switchdataD_00138a30)[uVar30];
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar4 != '\x02') {
      return 10;
    }
    local_a8.base = (uint8_t *)0x0;
    local_a8.len = 0;
    local_c8 = (ptls_raw_extension_t *)((long)&emitter_00->buf + 4);
    local_98.base._0_1_ = 0;
    local_98.base._1_1_ = 0;
    local_98.base._2_2_ = 0;
    local_98.base._4_1_ = 0;
    local_98.base._5_1_ = 0;
    local_98.base._6_1_ = 0;
    local_98.base._7_1_ = 0;
    local_98.capacity = 0;
    local_98.off = 0;
    local_98.is_allocated = 0;
    local_98._28_4_ = 0;
    local_78 = (undefined1  [16])0x0;
    _local_68 = (undefined1  [16])0x0;
    local_58.base = (uint8_t *)0x0;
    local_58.len = 0;
    uVar30 = 0x32;
    if ((5 < (long)puVar27) &&
       (local_c8 = (ptls_raw_extension_t *)((long)&emitter_00->buf + 6), 0x25 < (long)puVar27)) {
      auVar55[0] = -(*(char *)((long)&emitter_00->record_header_length + 6) == -0x3e);
      auVar55[1] = -(*(char *)((long)&emitter_00->record_header_length + 7) == -0x5e);
      auVar55[2] = -(*(char *)&emitter_00->begin_message == '\x11');
      auVar55[3] = -(*(char *)((long)&emitter_00->begin_message + 1) == '\x16');
      auVar55[4] = -(*(char *)((long)&emitter_00->begin_message + 2) == 'z');
      auVar55[5] = -(*(char *)((long)&emitter_00->begin_message + 3) == -0x45);
      auVar55[6] = -(*(char *)((long)&emitter_00->begin_message + 4) == -0x74);
      auVar55[7] = -(*(char *)((long)&emitter_00->begin_message + 5) == '^');
      auVar55[8] = -(*(char *)((long)&emitter_00->begin_message + 6) == '\a');
      auVar55[9] = -(*(char *)((long)&emitter_00->begin_message + 7) == -0x62);
      auVar55[10] = -(*(char *)&emitter_00->commit_message == '\t');
      auVar55[0xb] = -(*(char *)((long)&emitter_00->commit_message + 1) == -0x1e);
      auVar55[0xc] = -(*(char *)((long)&emitter_00->commit_message + 2) == -0x38);
      auVar55[0xd] = -(*(char *)((long)&emitter_00->commit_message + 3) == -0x58);
      auVar55[0xe] = -(*(char *)((long)&emitter_00->commit_message + 4) == '3');
      auVar55[0xf] = -(*(char *)((long)&emitter_00->commit_message + 5) == -100);
      auVar54[0] = -(*(char *)((long)&emitter_00->buf + 6) == -0x31);
      auVar54[1] = -(*(char *)((long)&emitter_00->buf + 7) == '!');
      auVar54[2] = -(*(char *)&emitter_00->enc == -0x53);
      auVar54[3] = -(*(char *)((long)&emitter_00->enc + 1) == 't');
      auVar54[4] = -(*(char *)((long)&emitter_00->enc + 2) == -0x1b);
      auVar54[5] = -(*(char *)((long)&emitter_00->enc + 3) == -0x66);
      auVar54[6] = -(*(char *)((long)&emitter_00->enc + 4) == 'a');
      auVar54[7] = -(*(char *)((long)&emitter_00->enc + 5) == '\x11');
      auVar54[8] = -(*(char *)((long)&emitter_00->enc + 6) == -0x42);
      auVar54[9] = -(*(char *)((long)&emitter_00->enc + 7) == '\x1d');
      auVar54[10] = -((char)emitter_00->record_header_length == -0x74);
      auVar54[0xb] = -(*(char *)((long)&emitter_00->record_header_length + 1) == '\x02');
      auVar54[0xc] = -(*(char *)((long)&emitter_00->record_header_length + 2) == '\x1e');
      auVar54[0xd] = -(*(char *)((long)&emitter_00->record_header_length + 3) == 'e');
      auVar54[0xe] = -(*(char *)((long)&emitter_00->record_header_length + 4) == -0x48);
      auVar54[0xf] = -(*(char *)((long)&emitter_00->record_header_length + 5) == -0x6f);
      auVar54 = auVar54 & auVar55;
      local_68[0] = (ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar54[0xf] >> 7) << 0xf) == 0xffff;
      local_68._1_3_ = 0;
      stack0xffffffffffffff9c = SUB1612((undefined1  [16])0x0,4);
      local_c8 = (ptls_raw_extension_t *)((long)&emitter_00->commit_message + 6);
      if (puVar27 != (uint8_t *)0x26) {
        local_c8 = (ptls_raw_extension_t *)((long)&emitter_00->commit_message + 7);
        bVar21 = *(byte *)((long)&emitter_00->commit_message + 6);
        puVar50 = (uint8_t *)(ulong)bVar21;
        if (puVar50 <= puVar27 + -0x27 && puVar50 < (uint8_t *)0x21) {
          ppVar46 = (ptls_raw_extension_t *)((long)&emitter_00->buf + (long)puVar27);
          ppVar42 = (ptls_raw_extension_t *)((long)&local_c8->type + (long)puVar50);
          local_78[8] = bVar21;
          local_78._0_8_ = local_c8;
          local_78._9_7_ = 0;
          if ((long)ppVar46 - (long)ppVar42 < 2) {
            uVar30 = 0x32;
            bVar53 = false;
            local_c8 = ppVar42;
          }
          else {
            local_c8 = (ptls_raw_extension_t *)&ppVar42->field_0x2;
            pppVar44 = tls->ctx->cipher_suites;
            ppVar10 = *pppVar44;
            while ((ppVar10 != (ptls_cipher_suite_t *)0x0 &&
                   (pppVar44 = pppVar44 + 1,
                   ppVar10->id != (uint16_t)(ppVar42->type << 8 | ppVar42->type >> 8)))) {
              ppVar10 = *pppVar44;
            }
            tls->cipher_suite = ppVar10;
            bVar53 = ppVar10 != (ptls_cipher_suite_t *)0x0;
            uVar30 = 0x2f;
            if (bVar53) {
              uVar30 = 0;
            }
          }
          if (bVar53) {
            ppVar42 = local_c8;
            if ((local_c8 == ppVar46) ||
               (ppVar42 = (ptls_raw_extension_t *)((long)&local_c8->type + 1),
               (uint8_t)local_c8->type != '\0')) {
LAB_0010ead7:
              local_c8 = ppVar42;
              uVar30 = 0x2f;
            }
            else {
              if ((bool)local_68[0]) {
                auStack_60._0_2_ = 0xffff;
                auStack_60._2_6_ = 0;
              }
              local_40[0] = 0x112421;
              local_40[1] = 0x2400;
              uVar22 = 0xffff;
              if ((ulong)((long)ppVar46 - (long)ppVar42) < 2) {
                bVar53 = false;
                sVar29 = -1;
                uVar30 = 0x32;
                local_c8 = ppVar42;
              }
              else {
                lVar34 = 0;
                uVar35 = 0;
                do {
                  uVar35 = (ulong)*(byte *)((long)&ppVar42->type + lVar34) | uVar35 << 8;
                  lVar34 = lVar34 + 1;
                } while (lVar34 != 2);
                local_c8 = (ptls_raw_extension_t *)&local_c8->field_0x3;
                if ((ulong)((long)ppVar46 - (long)local_c8) < uVar35) {
                  bVar53 = false;
                  sVar29 = -1;
                  uVar30 = 0x32;
                }
                else {
                  if (uVar35 == 0) {
                    sVar29 = -1;
                  }
                  else {
                    ppVar42 = (ptls_raw_extension_t *)((long)local_c8 + uVar35);
                    local_48 = CONCAT62(local_48._2_6_,0xffff);
                    uVar22 = 0xffff;
                    do {
                      ppVar20 = local_c8;
                      uVar30 = 0x32;
                      if ((long)ppVar42 - (long)local_c8 < 2) {
LAB_0010fd35:
                        bVar53 = false;
                        sVar29 = (short)local_48;
                        goto LAB_0010fd44;
                      }
                      uVar6 = local_c8->type;
                      uVar47 = uVar6 << 8 | uVar6 >> 8;
                      uVar31 = (uint)uVar47;
                      ppVar36 = (ptls_raw_extension_t *)&local_c8->field_0x2;
                      if (uVar47 < 0x40) {
                        if ((*(byte *)((long)local_40 + (ulong)(uVar47 >> 3)) >> (uVar31 & 7) & 1)
                            != 0) {
                          uVar30 = 0x2f;
                          local_c8 = ppVar36;
                          goto LAB_0010fd35;
                        }
                        pbVar1 = (byte *)((long)local_40 + (ulong)(uVar47 >> 3));
                        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)(uVar6 >> 8) & 7));
                      }
                      uVar30 = 0x32;
                      uVar41 = 2;
                      if (1 < (ulong)((long)ppVar42 - (long)ppVar36)) {
                        lVar34 = 0;
                        uVar35 = 0;
                        do {
                          uVar35 = (ulong)*(byte *)((long)ppVar36 + lVar34) | uVar35 << 8;
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != 2);
                        local_c8 = (ptls_raw_extension_t *)&local_c8->field_0x4;
                        ppVar36 = local_c8;
                        local_b8 = local_c8;
                        if (uVar35 <= (ulong)((long)ppVar42 - (long)local_c8)) {
                          psVar13 = tls->ctx->on_extension;
                          if (psVar13 == (st_ptls_on_extension_t *)0x0) {
                            uVar30 = 0;
LAB_0010f7aa:
                            local_b0 = (ptls_raw_extension_t *)((long)&local_b8->type + uVar35);
                            ppVar36 = local_b0;
                            if (uVar31 < 0x2c) {
                              if (uVar31 == 0x29) {
                                uVar30 = 0x2f;
                                if (local_68._0_4_ == 0) {
                                  uVar30 = 0x32;
                                  if (1 < (long)uVar35) {
                                    local_48 = CONCAT62(local_48._2_6_,
                                                        *(ushort *)&ppVar20->field_0x4 << 8 |
                                                        *(ushort *)&ppVar20->field_0x4 >> 8);
                                    goto LAB_0010f85a;
                                  }
                                  goto LAB_0010f865;
                                }
                              }
                              else {
                                if (uVar31 != 0x2b) goto LAB_0010f88b;
                                uVar30 = 0x32;
                                if (1 < (long)uVar35) {
                                  uVar22 = *(ushort *)&ppVar20->field_0x4 << 8 |
                                           *(ushort *)&ppVar20->field_0x4 >> 8;
LAB_0010f85a:
                                  local_c8 = (ptls_raw_extension_t *)&ppVar20->field_0x6;
                                  uVar30 = 0;
                                }
LAB_0010f865:
                                if (1 < (long)uVar35) {
                                  uVar30 = 0;
                                  ppVar36 = local_c8;
                                  goto LAB_0010f88b;
                                }
                              }
LAB_0010f93e:
                              uVar41 = 2;
                              ppVar36 = local_c8;
                            }
                            else {
                              if (uVar31 == 0x2c) {
                                if (local_68._0_4_ == 0) {
                                  uVar30 = 0x2f;
                                  goto LAB_0010f93e;
                                }
                                local_bc = 2;
                                uVar31 = 0x32;
                                if (uVar35 < 2) {
                                  bVar53 = false;
                                }
                                else {
                                  lVar34 = 0;
                                  uVar35 = 0;
                                  do {
                                    uVar35 = (ulong)*(byte *)((long)&local_b8->type + lVar34) |
                                             uVar35 << 8;
                                    lVar34 = lVar34 + 1;
                                  } while (lVar34 != 2);
                                  puVar28 = &ppVar20->field_0x6;
                                  bVar53 = false;
                                  local_c8 = (ptls_raw_extension_t *)puVar28;
                                  if (uVar35 - 1 < (ulong)((long)local_b0 - (long)puVar28)) {
                                    local_c8 = (ptls_raw_extension_t *)(puVar28 + uVar35);
                                    local_58.len = uVar35;
                                    local_58.base = puVar28;
                                    bVar53 = true;
                                    local_bc = 0;
                                    uVar31 = uVar30;
                                  }
                                }
                                uVar30 = uVar31;
                                uVar41 = local_bc;
                                ppVar36 = local_c8;
                                if (!bVar53) goto LAB_0010f95d;
                                if (local_c8 != local_b0) {
                                  uVar30 = 0x32;
                                  goto LAB_0010f784;
                                }
                              }
                              else if (uVar31 == 0x33) {
                                if (local_68._0_4_ != 0) {
                                  uVar30 = 0x32;
                                  if (1 < (long)uVar35) {
                                    auStack_60._0_2_ =
                                         *(ushort *)&ppVar20->field_0x4 << 8 |
                                         *(ushort *)&ppVar20->field_0x4 >> 8;
                                    goto LAB_0010f85a;
                                  }
                                  goto LAB_0010f865;
                                }
                                uVar30 = decode_key_share_entry
                                                   ((uint16_t *)&local_34,(ptls_iovec_t *)auStack_60
                                                    ,(uint8_t **)&local_c8,(uint8_t *)local_b0);
                                uVar41 = 2;
                                if (uVar30 == 0) {
                                  if (local_c8 != local_b0) {
                                    uVar30 = 0x32;
                                    goto LAB_0010f913;
                                  }
                                  uVar30 = 0x2f;
                                  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0)
                                  goto LAB_0010f913;
                                  bVar53 = false;
                                  if (tls->key_share->id == (uint16_t)local_34) {
                                    bVar53 = true;
                                    uVar41 = 0;
                                    uVar30 = 0;
                                  }
                                }
                                else {
LAB_0010f913:
                                  bVar53 = false;
                                }
                                ppVar36 = local_c8;
                                if (!bVar53) goto LAB_0010f95d;
                              }
LAB_0010f88b:
                              local_c8 = ppVar36;
                              if (local_c8 != local_b0) {
                                uVar30 = 0x32;
                              }
                              uVar41 = (uint)(local_c8 != local_b0) * 2;
                              ppVar36 = local_c8;
                            }
                          }
                          else {
                            pVar61.len = uVar35;
                            pVar61.base = (uint8_t *)local_c8;
                            iVar23 = (*psVar13->cb)(psVar13,tls,'\x02',uVar47,pVar61);
                            uVar30 = (uint)(iVar23 != 0);
                            if (iVar23 == 0) goto LAB_0010f7aa;
LAB_0010f784:
                            uVar41 = 2;
                            ppVar36 = local_c8;
                          }
                        }
                      }
LAB_0010f95d:
                      local_c8 = ppVar36;
                      if (uVar41 != 0) goto LAB_0010fd35;
                    } while (local_c8 != ppVar42);
                    sVar29 = (short)local_48;
                  }
                  bVar53 = true;
                }
              }
LAB_0010fd44:
              if ((bVar53) && (uVar30 = 0x32, local_c8 == ppVar46)) {
                lVar34 = 0;
                do {
                  puVar33 = (ushort *)((long)supported_versions + lVar34);
                  if (*puVar33 == uVar22) break;
                  bVar53 = lVar34 != 6;
                  lVar34 = lVar34 + 2;
                } while (bVar53);
                ppVar42 = local_c8;
                if (*puVar33 != uVar22) goto LAB_0010ead7;
                if (local_68._0_4_ == 0) {
                  if (sVar29 != -1) {
                    if ((sVar29 != 0) ||
                       (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
                    goto LAB_0010ead7;
                    tls->field_0x160 = tls->field_0x160 | 2;
                  }
                  if ((auStack_60 == (undefined1  [8])0x0) &&
                     (uVar30 = 0x2f, (tls->field_0x160 & 2) == 0)) goto LAB_0010eadd;
                }
                uVar30 = 0;
              }
            }
          }
        }
      }
    }
LAB_0010eadd:
    if (uVar30 == 0) {
      sVar48 = (tls->field_18).client.legacy_session_id.len;
      uVar30 = 0x2f;
      if (local_78._8_8_ == sVar48) {
        iVar23 = (*ptls_mem_equal)((void *)local_78._0_8_,
                                   (tls->field_18).client.legacy_session_id.base,sVar48);
        if (iVar23 != 0) {
          if (local_68._0_4_ == 0) {
            uVar30 = 0;
            if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
              uVar30 = (uint)((tls->field_0x160 & 2) == 0);
            }
            uVar30 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar30);
            if (uVar30 == 0) {
              if (auStack_60 != (undefined1  [8])0x0) {
                pVar57.len = (size_t)local_58.base;
                pVar57.base = (uint8_t *)auStack_60;
                uVar30 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                                   (&(tls->field_18).client.key_share_ctx,1,&local_a8,pVar57);
                if (uVar30 != 0) goto LAB_0010ec43;
              }
              ppVar8 = tls->key_schedule;
              if (ppVar8->num_hashes != 0) {
                pppVar51 = &ppVar8->hashes[0].ctx;
                sVar48 = 0;
                do {
                  (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
                  sVar48 = sVar48 + 1;
                  pppVar51 = pppVar51 + 2;
                } while (sVar48 != ppVar8->num_hashes);
              }
              uVar30 = key_schedule_extract(tls->key_schedule,local_a8);
              if ((uVar30 == 0) &&
                 (uVar30 = setup_traffic_protection(tls,0,"s hs traffic",2,0), uVar30 == 0)) {
                if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
                  uVar30 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_0010f030:
                  if (uVar30 == 0) {
LAB_0010f038:
                    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                    uVar30 = 0x202;
                  }
                }
                else {
                  puVar27 = (uint8_t *)malloc(0x40);
                  tls->pending_handshake_secret = puVar27;
                  if (puVar27 == (uint8_t *)0x0) {
                    uVar30 = 0x201;
                  }
                  else {
                    uVar30 = derive_secret(tls->key_schedule,puVar27,"c hs traffic");
                    if (uVar30 == 0) {
                      psVar14 = tls->ctx->update_traffic_key;
                      if (psVar14 != (st_ptls_update_traffic_key_t *)0x0) {
                        uVar30 = (*psVar14->cb)(psVar14,tls,1,2,tls->pending_handshake_secret);
                        goto LAB_0010f030;
                      }
                      goto LAB_0010f038;
                    }
                  }
                }
              }
            }
          }
          else {
            uVar30 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
            if (uVar30 == 0) {
              ppVar11 = (tls->field_18).client.key_share_ctx;
              if (ppVar11 != (ptls_key_exchange_context_t *)0x0) {
                pppVar2 = &(tls->field_18).client.key_share_ctx;
                (*ppVar11->on_exchange)(pppVar2,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                *pppVar2 = (ptls_key_exchange_context_t *)0x0;
              }
              if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
                  __ptr = (tls->traffic_protection).enc.aead;
                  if (__ptr == (st_ptls_aead_context_t *)0x0) {
                    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                  ,0x912,
                                  "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  (*__ptr->dispose_crypto)(__ptr);
                  free(__ptr);
                  (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                }
                puVar50 = (tls->field_18).server.pending_traffic_secret + 0x38;
                *puVar50 = *puVar50 & 0xfd;
              }
              if (auStack_60._0_2_ == 0xffff) {
                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
              }
              else {
                pppVar32 = tls->ctx->key_exchanges;
                ppVar12 = *pppVar32;
                if (ppVar12 == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
                uVar5 = ppVar12->id;
                while (uVar5 != auStack_60._0_2_) {
                  pppVar32 = pppVar32 + 1;
                  ppVar12 = *pppVar32;
                  if (ppVar12 == (ptls_key_exchange_algorithm_t *)0x0) {
                    return 0x2f;
                  }
                  uVar5 = ppVar12->id;
                }
                tls->key_share = ppVar12;
              }
              key_schedule_transform_post_ch1hash(tls->key_schedule);
              ppVar8 = tls->key_schedule;
              if (ppVar8->num_hashes != 0) {
                pppVar51 = &ppVar8->hashes[0].ctx;
                sVar48 = 0;
                do {
                  (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
                  sVar48 = sVar48 + 1;
                  pppVar51 = pppVar51 + 2;
                } while (sVar48 != ppVar8->num_hashes);
              }
              iVar23 = send_client_hello(tls,emitter,properties,&local_58);
              return iVar23;
            }
          }
        }
      }
    }
LAB_0010ec43:
    if (local_a8.base == (uint8_t *)0x0) {
      return uVar30;
    }
    (*ptls_clear_memory)(local_a8.base,local_a8.len);
    puVar28 = local_a8.base;
    goto LAB_0010f205;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar4 != '\b') {
      return 10;
    }
    local_98.base._2_2_ = 0;
    local_98.base._4_1_ = 0;
    local_98.base._7_1_ = 0;
    local_98.base._0_1_ = 0x20;
    local_98.base._1_1_ = 0x20;
    local_98.base._6_1_ = 8;
    local_98.base._5_1_ = 0x3a;
    puVar33 = (ushort *)((long)&emitter_00->buf + 4);
    puVar28 = client_handle_encrypted_extensions_no_unknown_extensions;
    uVar30 = 0x32;
    bVar53 = true;
    if (((ulong)puVar27 & 0xfffffffffffffffe) == 4) {
      uVar31 = 0;
      bVar52 = false;
      pcVar39 = (char *)0x0;
    }
    else {
      lVar34 = 0;
      puVar50 = (uint8_t *)0x0;
      do {
        puVar50 = (uint8_t *)((ulong)*(byte *)((long)puVar33 + lVar34) | (long)puVar50 << 8);
        lVar34 = lVar34 + 1;
      } while (lVar34 != 2);
      puVar33 = (ushort *)((long)&emitter_00->buf + 6);
      bVar53 = true;
      if (puVar50 <= puVar27 + -6) {
        if (puVar50 != (uint8_t *)0x0) {
          puVar49 = (ushort *)(puVar50 + (long)puVar33);
          local_b0 = (ptls_raw_extension_t *)CONCAT44(local_b0._4_4_,1);
          puVar28 = client_handle_encrypted_extensions_no_unknown_extensions;
          pcVar39 = (char *)0x0;
          local_48 = 0;
          do {
            lVar34 = (long)puVar49 - (long)puVar33;
            uVar30 = 0x32;
            ppVar43 = emitter;
            if (1 < lVar34) {
              ppVar43 = (ptls_message_emitter_t *)(ulong)(ushort)(*puVar33 << 8 | *puVar33 >> 8);
              puVar33 = puVar33 + 1;
              uVar30 = 0;
            }
            bVar53 = true;
            if (lVar34 < 2) goto LAB_0010f09e;
            uVar22 = (ushort)ppVar43;
            if (uVar22 < 0x40) {
              uVar35 = ((ulong)ppVar43 & 0xffff) >> 3;
              if ((*(byte *)((long)&local_98.base + uVar35) >> ((uint)ppVar43 & 7) & 1) != 0) {
                uVar30 = 0x2f;
                goto LAB_0010f09e;
              }
              pbVar1 = (byte *)((long)&local_98.base + uVar35);
              *pbVar1 = *pbVar1 | (byte)(1 << ((byte)ppVar43 & 7));
            }
            uVar30 = 0x32;
            bVar53 = true;
            emitter = ppVar43;
            if (1 < (ulong)((long)puVar49 - (long)puVar33)) {
              lVar34 = 0;
              uVar35 = 0;
              do {
                uVar35 = (ulong)*(byte *)((long)puVar33 + lVar34) | uVar35 << 8;
                lVar34 = lVar34 + 1;
              } while (lVar34 != 2);
              puVar40 = puVar33 + 1;
              if (uVar35 <= (ulong)((long)puVar49 - (long)puVar40)) {
                psVar13 = tls->ctx->on_extension;
                if (psVar13 == (st_ptls_on_extension_t *)0x0) {
                  uVar31 = 0;
                }
                else {
                  pVar59.len = uVar35;
                  pVar59.base = (uint8_t *)puVar40;
                  local_b8 = (ptls_raw_extension_t *)puVar28;
                  iVar23 = (*psVar13->cb)(psVar13,tls,'\b',uVar22,pVar59);
                  bVar53 = iVar23 != 0;
                  uVar31 = (uint)bVar53;
                  puVar28 = (undefined1 *)local_b8;
                  if (bVar53) {
                    uVar30 = (uint)bVar53;
                    goto LAB_0010e570;
                  }
                }
                uVar41 = (uint)ppVar43 & 0xffff;
                src = (ushort *)((long)puVar33 + uVar35 + 2);
                if (uVar41 < 0x14) {
                  if (((ulong)ppVar43 & 0xffff) == 0) {
                    if (uVar35 != 0) goto LAB_0010e570;
                    uVar30 = 0x2f;
                    if (tls->server_name != (char *)0x0) {
                      local_bc = uVar31;
                      local_b8 = (ptls_raw_extension_t *)puVar28;
                      iVar23 = ptls_server_name_is_ipaddr(tls->server_name);
                      bVar53 = true;
                      emitter = (ptls_message_emitter_t *)((ulong)ppVar43 & 0xffffffff);
                      puVar28 = (undefined1 *)local_b8;
                      puVar33 = puVar40;
                      uVar31 = local_bc;
                      if (iVar23 == 0) goto LAB_0010e92e;
                      goto LAB_0010e574;
                    }
                  }
                  else if (uVar41 == 0x10) {
                    uVar30 = 0x32;
                    bVar53 = true;
                    if (1 < uVar35) {
                      lVar34 = 0;
                      uVar35 = 0;
                      do {
                        uVar35 = (ulong)*(byte *)((long)puVar40 + lVar34) | uVar35 << 8;
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 2);
                      puVar40 = puVar33 + 2;
                      if ((ulong)((long)src - (long)puVar40) < uVar35) {
                        uVar30 = 0x32;
                      }
                      else {
                        puVar3 = (ushort *)((long)puVar40 + uVar35);
                        bVar53 = true;
                        if (uVar35 == 0) {
                          local_bc = 0x32;
                          bVar52 = false;
                        }
                        else {
                          uVar35 = (ulong)(byte)puVar33[2];
                          puVar40 = (ushort *)((long)puVar33 + 5);
                          if (((ulong)((long)puVar3 - (long)puVar40) < uVar35) ||
                             (local_bc = 0x32, uVar35 == 0)) {
                            local_bc = 0x32;
                            bVar52 = false;
                          }
                          else {
                            local_b8 = (ptls_raw_extension_t *)puVar28;
                            uVar30 = ptls_set_negotiated_protocol(tls,(char *)puVar40,uVar35);
                            local_bc = 0;
                            bVar52 = uVar30 == 0;
                            if (bVar52) {
                              puVar40 = (ushort *)((long)puVar40 + uVar35);
                              uVar30 = local_bc;
                            }
                            local_bc = uVar30;
                            bVar53 = !bVar52;
                            puVar28 = (undefined1 *)local_b8;
                          }
                        }
                        uVar30 = local_bc;
                        if (bVar52) {
                          bVar53 = puVar40 != puVar3;
                          if (bVar53) {
                            uVar30 = 0x28;
                          }
                        }
                      }
                    }
                    if (bVar53) goto LAB_0010e933;
                    uVar31 = uVar30;
                    if (puVar40 == src) goto LAB_0010e92e;
                    uVar30 = 0x32;
                  }
                  else {
LAB_0010e6cf:
                    if (((properties == (ptls_handshake_properties_t *)0x0) ||
                        (properties->collect_extension ==
                         (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0))
                       || (ppVar46 = (ptls_raw_extension_t *)puVar28,
                          iVar23 = (*properties->collect_extension)(tls,properties,uVar22),
                          iVar23 == 0)) goto LAB_0010e92e;
                    if (puVar28 == client_handle_encrypted_extensions_no_unknown_extensions) {
                      puVar28 = (undefined1 *)malloc(0x198);
                      if ((ptls_raw_extension_t *)puVar28 == (ptls_raw_extension_t *)0x0) {
                        uVar30 = 0x201;
                        puVar28 = (undefined1 *)0x0;
                        goto LAB_0010e924;
                      }
                      ((ptls_raw_extension_t *)puVar28)->type = 0xffff;
                    }
                    uVar30 = collect_unknown_extension
                                       ((ptls_t *)(ulong)uVar41,(uint16_t)puVar40,(uint8_t *)src,
                                        puVar28,ppVar46);
                    if (uVar30 == 0) {
                      uVar31 = 0;
                      goto LAB_0010e92e;
                    }
                  }
LAB_0010e924:
                  bVar53 = true;
                  emitter = (ptls_message_emitter_t *)((ulong)ppVar43 & 0xffffffff);
                  puVar33 = puVar40;
                  goto LAB_0010e574;
                }
                if (uVar41 == 0x14) {
                  if (uVar35 == 1) {
                    local_48 = CONCAT71((int7)((ulong)src >> 8),(char)*puVar40);
LAB_0010e92e:
                    bVar53 = false;
                    puVar40 = src;
                    uVar30 = uVar31;
LAB_0010e933:
                    emitter = (ptls_message_emitter_t *)((ulong)ppVar43 & 0xffffffff);
                    puVar33 = puVar40;
                    goto LAB_0010e574;
                  }
                }
                else if (uVar41 == 0x2a) {
                  uVar30 = 0x2f;
                  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                    local_b0 = (ptls_raw_extension_t *)((ulong)local_b0 & 0xffffffff00000000);
                    goto LAB_0010e92e;
                  }
                }
                else {
                  if (uVar41 != 0xffce) goto LAB_0010e6cf;
                  uVar30 = 0x208;
                  if (((char)*puVar40 == '\0') && (uVar30 = 0x2f, uVar35 == 0x11)) {
                    pcVar39 = (char *)((long)puVar33 + 3);
                    goto LAB_0010e92e;
                  }
                }
              }
LAB_0010e570:
              bVar53 = true;
              emitter = (ptls_message_emitter_t *)((ulong)ppVar43 & 0xffffffff);
              puVar33 = puVar40;
            }
LAB_0010e574:
            if (bVar53) goto LAB_0010f09e;
          } while (puVar33 != puVar49);
          bVar53 = false;
LAB_0010f09e:
          uVar31 = (uint)(byte)local_48;
          bVar52 = (int)local_b0 == 0;
          goto LAB_0010f0b3;
        }
        bVar53 = false;
      }
      uVar31 = 0;
      bVar52 = false;
      pcVar39 = (char *)0x0;
    }
LAB_0010f0b3:
    if (!bVar53) {
      if (bVar53) {
        return uVar30;
      }
      uVar30 = 0x32;
      if ((puVar33 == (ushort *)((long)&emitter_00->buf + (long)puVar27)) &&
         (uVar30 = 0x2b, uVar31 == (*(uint *)&tls->ctx->field_0x70 >> 4 & 2))) {
        uVar30 = 0x2f;
        if (tls->esni == (ptls_esni_secret_t *)0x0) {
          if (pcVar39 == (char *)0x0) goto LAB_0010f15b;
        }
        else if ((pcVar39 != (char *)0x0) &&
                (iVar23 = (*ptls_mem_equal)(pcVar39,tls->esni->nonce,0x10), iVar23 != 0)) {
          free_esni_secret(&tls->esni,0);
LAB_0010f15b:
          bVar21 = (tls->field_18).server.pending_traffic_secret[0x38];
          if ((bVar21 & 2) != 0) {
            if (bVar52 == false) {
              (tls->field_18).server.pending_traffic_secret[0x38] = bVar21 & 0xfd;
            }
            if (properties != (ptls_handshake_properties_t *)0x0) {
              (properties->field_0).client.early_data_acceptance = bVar52 + PTLS_EARLY_DATA_REJECTED
              ;
            }
          }
          local_b8 = (ptls_raw_extension_t *)puVar28;
          uVar30 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)puVar28);
          puVar28 = (undefined1 *)local_b8;
          if (uVar30 == 0) {
            ppVar8 = tls->key_schedule;
            if (ppVar8->num_hashes != 0) {
              pppVar51 = &ppVar8->hashes[0].ctx;
              sVar48 = 0;
              do {
                (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
                sVar48 = sVar48 + 1;
                pppVar51 = pppVar51 + 2;
              } while (sVar48 != ppVar8->num_hashes);
            }
            bVar21 = (tls->field_0x160 & 2) >> 1;
            tls->state = (uint)bVar21 + (uint)bVar21 * 2 +
                         PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
            uVar30 = 0x202;
            puVar28 = (undefined1 *)local_b8;
          }
        }
      }
    }
    if (puVar28 == client_handle_encrypted_extensions_no_unknown_extensions) {
      return uVar30;
    }
    goto LAB_0010f205;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar4 != '\x19') {
      if (cVar4 != '\v') {
        return 10;
      }
      goto LAB_0010e357;
    }
LAB_0010e325:
    psVar9 = tls->ctx->decompress_certificate;
    if (psVar9 == (st_ptls_decompress_certificate_t *)0x0) {
      uVar30 = 10;
    }
    else if ((long)puVar27 < 6) {
      uVar30 = 0x32;
    }
    else {
      uVar22 = *(ushort *)((long)&emitter_00->buf + 4);
      pbVar1 = (byte *)((long)&emitter_00->buf + 6);
      puVar50 = (uint8_t *)((long)&emitter_00->buf + (long)puVar27);
      if ((long)puVar50 - (long)pbVar1 < 3) {
        uVar30 = 0x32;
      }
      else {
        uVar31 = (uint)*(byte *)&emitter_00->enc |
                 (uint)*(byte *)((long)&emitter_00->buf + 7) << 8 | (uint)*pbVar1 << 0x10;
        puVar37 = (uint8_t *)((long)&emitter_00->enc + 1);
        if (uVar31 < 0x10001) {
          ppVar46 = (ptls_raw_extension_t *)(ulong)uVar31;
          puVar28 = (undefined1 *)malloc((size_t)ppVar46);
          if ((ptls_raw_extension_t *)puVar28 != (ptls_raw_extension_t *)0x0) {
            uVar30 = 0x32;
            local_b8 = ppVar46;
            if ((ulong)((long)puVar50 - (long)puVar37) < 3) {
              bVar53 = false;
            }
            else {
              lVar34 = 0;
              uVar35 = 0;
              do {
                uVar35 = (ulong)puVar37[lVar34] | uVar35 << 8;
                lVar34 = lVar34 + 1;
              } while (lVar34 != 3);
              puVar37 = (uint8_t *)((long)&emitter_00->enc + 4);
              if ((ulong)((long)puVar50 - (long)puVar37) < uVar35) {
                bVar53 = false;
              }
              else {
                local_98.base._0_1_ = SUB81(puVar37,0);
                local_98.base._1_1_ = (undefined1)((ulong)puVar37 >> 8);
                local_98.base._2_2_ = (undefined2)((ulong)puVar37 >> 0x10);
                local_98.base._4_1_ = (undefined1)((ulong)puVar37 >> 0x20);
                local_98.base._5_1_ = (undefined1)((ulong)puVar37 >> 0x28);
                local_98.base._6_1_ = (undefined1)((ulong)puVar37 >> 0x30);
                local_98.base._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
                pVar17.len = uVar35;
                pVar17.base = puVar37;
                pVar58.len._0_4_ = uVar31;
                pVar58.base = puVar28;
                pVar58.len._4_4_ = 0;
                local_98.capacity = uVar35;
                uVar30 = (*psVar9->cb)(psVar9,tls,uVar22 << 8 | uVar22 >> 8,pVar58,pVar17);
                bVar53 = uVar30 == 0;
                if (bVar53) {
                  puVar37 = puVar37 + uVar35;
                  uVar30 = 0;
                }
              }
            }
            if ((bVar53) && (uVar30 = 0x32, puVar37 == puVar50)) {
              uVar31 = handle_certificate(tls,puVar28,
                                          (uint8_t *)
                                          ((long)&((ptls_raw_extension_t *)puVar28)->type +
                                          (long)local_b8),(int *)&local_a8);
              uVar30 = 0x2f;
              if ((int)local_a8.base != 0) {
                uVar30 = 0;
              }
              if (uVar31 != 0) {
                uVar30 = uVar31;
              }
              if (uVar30 == 0) {
                ppVar8 = tls->key_schedule;
                if (ppVar8->num_hashes != 0) {
                  pppVar51 = &ppVar8->hashes[0].ctx;
                  sVar48 = 0;
                  do {
                    (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
                    sVar48 = sVar48 + 1;
                    pppVar51 = pppVar51 + 2;
                  } while (sVar48 != ppVar8->num_hashes);
                }
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                uVar30 = 0x202;
              }
            }
            goto LAB_0010f205;
          }
          uVar30 = 0x201;
        }
        else {
          uVar30 = 0x2a;
        }
      }
    }
    puVar28 = (undefined1 *)0x0;
LAB_0010f205:
    free(puVar28);
    return uVar30;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar4 != '\x0f') {
      return 10;
    }
    iVar23 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar23 == 0) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
      return 0x202;
    }
    return iVar23;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar4 != '\x14') {
      return 10;
    }
    iVar23 = verify_finished(tls,message);
    if (iVar23 == 0) {
      ppVar8 = tls->key_schedule;
      if (ppVar8->num_hashes != 0) {
        pppVar51 = &ppVar8->hashes[0].ctx;
        sVar48 = 0;
        do {
          (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
          sVar48 = sVar48 + 1;
          pppVar51 = pppVar51 + 2;
        } while (sVar48 != ppVar8->num_hashes);
      }
      iVar23 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar23 == 0) &&
           (iVar23 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar23 == 0)) &&
          (iVar23 = derive_secret(tls->key_schedule,&local_98,"c ap traffic"), iVar23 == 0)) &&
         (iVar23 = derive_exporter_secret(tls,0), iVar23 == 0)) {
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xb84,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          if ((((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) &&
             ((tls->ctx->field_0x70 & 0x10) == 0)) {
            iVar23 = (*emitter->begin_message)(emitter);
            if (iVar23 == 0) {
              buf = emitter->buf;
              ppVar8 = tls->key_schedule;
              sVar48 = buf->off;
              iVar23 = ptls_buffer_reserve(buf,1);
              if (iVar23 == 0) {
                buf->base[buf->off] = '\x05';
                buf->off = buf->off + 1;
                iVar23 = 0;
              }
              bVar53 = true;
              if (iVar23 == 0) {
                iVar24 = ptls_buffer_reserve(buf,3);
                if (iVar24 == 0) {
                  puVar27 = buf->base;
                  sVar15 = buf->off;
                  puVar27[sVar15 + 2] = '\0';
                  puVar27 = puVar27 + sVar15;
                  puVar27[0] = '\0';
                  puVar27[1] = '\0';
                  buf->off = buf->off + 3;
                  iVar24 = 0;
                }
                bVar53 = true;
                iVar23 = iVar24;
                if (iVar24 == 0) {
                  sVar15 = buf->off;
                  lVar34 = -3;
                  do {
                    buf->base[lVar34 + sVar15] = '\0';
                    lVar34 = lVar34 + 1;
                  } while (lVar34 != 0);
                  bVar53 = false;
                  iVar23 = 0;
                }
                if (((iVar24 == 0) && (bVar53 = false, ppVar8 != (ptls_key_schedule_t *)0x0)) &&
                   (ppVar8->num_hashes != 0)) {
                  puVar27 = buf->base;
                  sVar15 = buf->off;
                  pppVar51 = &ppVar8->hashes[0].ctx;
                  bVar53 = false;
                  sVar38 = 0;
                  do {
                    (*(*pppVar51)->update)(*pppVar51,puVar27 + sVar48,sVar15 - sVar48);
                    sVar38 = sVar38 + 1;
                    pppVar51 = pppVar51 + 2;
                  } while (sVar38 != ppVar8->num_hashes);
                }
              }
              if (!bVar53) {
                iVar23 = (*emitter->commit_message)(emitter);
                bVar53 = iVar23 != 0;
              }
            }
            else {
              bVar53 = true;
            }
            if (bVar53) goto LAB_0010e30a;
            if (bVar53) {
              return iVar23;
            }
          }
          puVar27 = (tls->field_18).server.pending_traffic_secret + 0x38;
          *puVar27 = *puVar27 & 0xfd;
          iVar23 = commission_handshake_secret(tls);
          if (iVar23 != 0) goto LAB_0010e30a;
        }
        iVar23 = push_change_cipher_spec(tls,emitter);
        if (iVar23 == 0) {
          puVar27 = (tls->field_18).client.certificate_request.context.base;
          if (puVar27 != (uint8_t *)0x0) {
            iVar23 = 0x2f;
            if ((tls->field_0x160 & 2) != 0) goto LAB_0010e30a;
            context.len = (tls->field_18).client.certificate_request.context.len;
            context.base = puVar27;
            iVar23 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_18).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
            free((tls->field_18).client.certificate_request.context.base);
            *(uint8_t **)((long)&tls->field_18 + 0x40) = (uint8_t *)0x0;
            *(size_t *)((long)&tls->field_18 + 0x48) = 0;
            if (iVar23 != 0) goto LAB_0010e30a;
          }
          send_finished(tls,emitter);
          *(ulong *)(tls->traffic_protection).enc.secret =
               CONCAT17(local_98.base._7_1_,
                        CONCAT16(local_98.base._6_1_,
                                 CONCAT15(local_98.base._5_1_,
                                          CONCAT14(local_98.base._4_1_,
                                                   CONCAT22(local_98.base._2_2_,
                                                            CONCAT11(local_98.base._1_1_,
                                                                     local_98.base._0_1_))))));
          *(size_t *)((tls->traffic_protection).enc.secret + 8) = local_98.capacity;
          *(size_t *)((tls->traffic_protection).enc.secret + 0x10) = local_98.off;
          *(ulong *)((tls->traffic_protection).enc.secret + 0x18) =
               CONCAT44(local_98._28_4_,local_98.is_allocated);
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x20) = local_78._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x28) = local_78._8_8_;
          *(undefined1 (*) [8])((tls->traffic_protection).enc.secret + 0x30) = local_68;
          *(undefined1 (*) [8])((tls->traffic_protection).enc.secret + 0x38) = auStack_60;
          iVar23 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
          if (iVar23 == 0) {
            tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
            iVar23 = 0;
          }
        }
      }
    }
LAB_0010e30a:
    (*ptls_clear_memory)(&local_98,0x40);
    return iVar23;
  default:
    goto switchD_0010de14_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar4 == '\x18') {
      pVar62.base = puVar27;
      iVar23 = handle_key_update(tls,emitter_00,pVar62);
      return iVar23;
    }
    if (cVar4 != '\x04') {
      return 10;
    }
    puVar50 = (uint8_t *)((long)&emitter_00->buf + 4);
    iVar23 = decode_new_session_ticket
                       (tls,(uint32_t *)&local_c8,local_40,&local_a8,(ptls_iovec_t *)&local_98,
                        &local_34,puVar50,(uint8_t *)((long)&emitter_00->buf + (long)puVar27));
    if (iVar23 != 0) {
      return iVar23;
    }
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      return 0;
    }
    local_98.base._0_1_ = 0x66;
    local_98.base._1_1_ = 0xa9;
    local_98.base._2_2_ = 0x13;
    local_98.base._4_1_ = 0;
    local_98.base._5_1_ = 0;
    local_98.base._6_1_ = 0;
    local_98.base._7_1_ = 0;
    local_98.capacity = 0;
    local_98.off = 0;
    local_98.is_allocated = 0;
    psVar7 = tls->ctx->get_time;
    uVar25 = (*psVar7->cb)(psVar7);
    iVar23 = ptls_buffer_reserve(&local_98,8);
    if (iVar23 == 0) {
      *(uint64_t *)
       (CONCAT17(local_98.base._7_1_,
                 CONCAT16(local_98.base._6_1_,
                          CONCAT15(local_98.base._5_1_,
                                   CONCAT14(local_98.base._4_1_,
                                            CONCAT22(local_98.base._2_2_,
                                                     CONCAT11(local_98.base._1_1_,
                                                              local_98.base._0_1_)))))) +
       local_98.off) =
           uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 | (uVar25 & 0xff0000000000) >> 0x18
           | (uVar25 & 0xff00000000) >> 8 | (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18
           | (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
      local_98.off = local_98.off + 8;
      iVar23 = 0;
    }
    if (iVar23 == 0) {
      uVar22 = tls->key_share->id;
      iVar23 = ptls_buffer_reserve(&local_98,2);
      if (iVar23 == 0) {
        *(ushort *)
         (CONCAT17(local_98.base._7_1_,
                   CONCAT16(local_98.base._6_1_,
                            CONCAT15(local_98.base._5_1_,
                                     CONCAT14(local_98.base._4_1_,
                                              CONCAT22(local_98.base._2_2_,
                                                       CONCAT11(local_98.base._1_1_,
                                                                local_98.base._0_1_)))))) +
         local_98.off) = uVar22 << 8 | uVar22 >> 8;
        local_98.off = local_98.off + 2;
        iVar23 = 0;
      }
      if (iVar23 == 0) {
        uVar22 = tls->cipher_suite->id;
        iVar23 = ptls_buffer_reserve(&local_98,2);
        if (iVar23 == 0) {
          *(ushort *)
           (CONCAT17(local_98.base._7_1_,
                     CONCAT16(local_98.base._6_1_,
                              CONCAT15(local_98.base._5_1_,
                                       CONCAT14(local_98.base._4_1_,
                                                CONCAT22(local_98.base._2_2_,
                                                         CONCAT11(local_98.base._1_1_,
                                                                  local_98.base._0_1_)))))) +
           local_98.off) = uVar22 << 8 | uVar22 >> 8;
          local_98.off = local_98.off + 2;
          iVar23 = 0;
        }
        if (iVar23 == 0) {
          iVar23 = ptls_buffer_reserve(&local_98,3);
          if (iVar23 == 0) {
            lVar34 = CONCAT17(local_98.base._7_1_,
                              CONCAT16(local_98.base._6_1_,
                                       CONCAT15(local_98.base._5_1_,
                                                CONCAT14(local_98.base._4_1_,
                                                         CONCAT22(local_98.base._2_2_,
                                                                  CONCAT11(local_98.base._1_1_,
                                                                           local_98.base._0_1_))))))
            ;
            *(undefined1 *)(lVar34 + 2 + local_98.off) = 0;
            *(undefined2 *)(lVar34 + local_98.off) = 0;
            local_98.off = local_98.off + 3;
            iVar23 = 0;
          }
          sVar48 = local_98.off;
          iVar24 = 6;
          if ((iVar23 == 0) &&
             (iVar23 = ptls_buffer__do_pushv(&local_98,puVar50,(size_t)(puVar27 + -4)),
             auVar54 = _DAT_001388f0, auVar19 = _DAT_001388e0, iVar23 == 0)) {
            uVar35 = local_98.off - sVar48;
            lVar34 = sVar48 + CONCAT17(local_98.base._7_1_,
                                       CONCAT16(local_98.base._6_1_,
                                                CONCAT15(local_98.base._5_1_,
                                                         CONCAT14(local_98.base._4_1_,
                                                                  CONCAT22(local_98.base._2_2_,
                                                                           CONCAT11(local_98.base.
                                                                                    _1_1_,local_98.
                                                  base._0_1_))))));
            bVar21 = 0x10;
            lVar45 = 0;
            do {
              auVar56._8_4_ = (int)lVar45;
              auVar56._0_8_ = lVar45;
              auVar56._12_4_ = (int)((ulong)lVar45 >> 0x20);
              auVar56 = (auVar56 | auVar19) ^ auVar54;
              if (auVar56._4_4_ == -0x80000000 && auVar56._0_4_ < -0x7ffffffd) {
                *(char *)(lVar34 + -3 + lVar45) = (char)(uVar35 >> (bVar21 & 0x3f));
                *(char *)(lVar34 + -2 + lVar45) = (char)(uVar35 >> (bVar21 - 8 & 0x3f));
              }
              lVar45 = lVar45 + 2;
              bVar21 = bVar21 - 0x10;
            } while (lVar45 != 4);
            iVar24 = 0;
            iVar23 = 0;
          }
          if (iVar24 != 6) {
            if (iVar24 != 0) {
              return 0;
            }
            iVar23 = ptls_buffer_reserve(&local_98,2);
            if (iVar23 == 0) {
              *(undefined2 *)
               (CONCAT17(local_98.base._7_1_,
                         CONCAT16(local_98.base._6_1_,
                                  CONCAT15(local_98.base._5_1_,
                                           CONCAT14(local_98.base._4_1_,
                                                    CONCAT22(local_98.base._2_2_,
                                                             CONCAT11(local_98.base._1_1_,
                                                                      local_98.base._0_1_)))))) +
               local_98.off) = 0;
              local_98.off = local_98.off + 2;
              iVar23 = 0;
            }
            sVar48 = local_98.off;
            iVar24 = 6;
            if ((iVar23 == 0) &&
               (iVar23 = ptls_buffer_reserve(&local_98,
                                             (tls->key_schedule->hashes[0].algo)->digest_size),
               sVar15 = local_98.off, iVar23 == 0)) {
              lVar34 = CONCAT17(local_98.base._7_1_,
                                CONCAT16(local_98.base._6_1_,
                                         CONCAT15(local_98.base._5_1_,
                                                  CONCAT14(local_98.base._4_1_,
                                                           CONCAT22(local_98.base._2_2_,
                                                                    CONCAT11(local_98.base._1_1_,
                                                                             local_98.base._0_1_))))
                                        ));
              iVar23 = derive_resumption_secret
                                 (tls->key_schedule,(uint8_t *)(lVar34 + local_98.off),local_a8);
              iVar24 = 6;
              if (iVar23 == 0) {
                local_98.off = sVar15 + (tls->key_schedule->hashes[0].algo)->digest_size;
                puVar28 = (undefined1 *)(lVar34 + sVar48 + -2);
                lVar34 = 8;
                do {
                  *puVar28 = (char)(local_98.off - sVar48 >> ((byte)lVar34 & 0x3f));
                  lVar34 = lVar34 + -8;
                  puVar28 = puVar28 + 1;
                } while (lVar34 != -8);
                iVar23 = 0;
                iVar24 = 0;
              }
            }
            if (iVar24 != 6) {
              if (iVar24 != 0) {
                return 0;
              }
              psVar16 = tls->ctx->save_ticket;
              pVar63.base._1_1_ = local_98.base._1_1_;
              pVar63.base._0_1_ = local_98.base._0_1_;
              pVar63.base._2_2_ = local_98.base._2_2_;
              pVar63.base._4_1_ = local_98.base._4_1_;
              pVar63.base._5_1_ = local_98.base._5_1_;
              pVar63.base._6_1_ = local_98.base._6_1_;
              pVar63.base._7_1_ = local_98.base._7_1_;
              pVar63.len = local_98.off;
              iVar23 = (*psVar16->cb)(psVar16,tls,pVar63);
            }
          }
        }
      }
    }
    pvVar18 = (void *)CONCAT17(local_98.base._7_1_,
                               CONCAT16(local_98.base._6_1_,
                                        CONCAT15(local_98.base._5_1_,
                                                 CONCAT14(local_98.base._4_1_,
                                                          CONCAT22(local_98.base._2_2_,
                                                                   CONCAT11(local_98.base._1_1_,
                                                                            local_98.base._0_1_)))))
                              );
    (*ptls_clear_memory)(pvVar18,local_98.off);
    if (local_98.is_allocated != 0) {
      free(pvVar18);
      return iVar23;
    }
    return iVar23;
  }
  if (cVar4 == '\v') {
LAB_0010e357:
    iVar24 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                (uint8_t *)((long)&emitter_00->buf + (long)puVar27),(int *)&local_98
                               );
    iVar23 = 0x2f;
    if (CONCAT22(local_98.base._2_2_,CONCAT11(local_98.base._1_1_,local_98.base._0_1_)) != 0) {
      iVar23 = 0;
    }
    if (iVar24 != 0) {
      iVar23 = iVar24;
    }
    if (iVar23 == 0) {
      ppVar8 = tls->key_schedule;
      if (ppVar8->num_hashes != 0) {
        pppVar51 = &ppVar8->hashes[0].ctx;
        sVar48 = 0;
        do {
          (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
          sVar48 = sVar48 + 1;
          pppVar51 = pppVar51 + 2;
        } while (sVar48 != ppVar8->num_hashes);
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
      return 0x202;
    }
    return iVar23;
  }
  if (cVar4 == '\x19') goto LAB_0010e325;
  if (cVar4 != '\r') {
    return 10;
  }
  puVar28 = (undefined1 *)((long)&emitter_00->buf + 4);
  local_98.base._0_1_ = SUB81(puVar28,0);
  local_98.base._1_1_ = (undefined1)((ulong)puVar28 >> 8);
  local_98.base._2_2_ = (undefined2)((ulong)puVar28 >> 0x10);
  local_98.base._4_1_ = (undefined1)((ulong)puVar28 >> 0x20);
  local_98.base._5_1_ = (undefined1)((ulong)puVar28 >> 0x28);
  local_98.base._6_1_ = (undefined1)((ulong)puVar28 >> 0x30);
  local_98.base._7_1_ = (undefined1)((ulong)puVar28 >> 0x38);
  uVar30 = 0x32;
  if (puVar27 == (uint8_t *)0x4) {
LAB_0010e238:
    bVar53 = false;
  }
  else {
    pvVar18 = (void *)((long)&emitter_00->buf + 5);
    local_98.base._0_1_ = SUB81(pvVar18,0);
    local_98.base._1_1_ = (undefined1)((ulong)pvVar18 >> 8);
    local_98.base._2_2_ = (undefined2)((ulong)pvVar18 >> 0x10);
    local_98.base._4_1_ = (undefined1)((ulong)pvVar18 >> 0x20);
    local_98.base._5_1_ = (undefined1)((ulong)pvVar18 >> 0x28);
    local_98.base._6_1_ = (undefined1)((ulong)pvVar18 >> 0x30);
    local_98.base._7_1_ = (undefined1)((ulong)pvVar18 >> 0x38);
    puVar50 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
    if (puVar27 + -5 < puVar50) goto LAB_0010e238;
    puVar37 = (uint8_t *)((long)pvVar18 + (long)puVar50);
    puVar26 = (uint8_t *)0x1;
    if (puVar50 != (uint8_t *)0x0) {
      puVar26 = puVar50;
    }
    puVar26 = (uint8_t *)malloc((size_t)puVar26);
    (tls->field_18).client.certificate_request.context.base = puVar26;
    if (puVar26 == (uint8_t *)0x0) {
      uVar31 = 0x201;
    }
    else {
      (tls->field_18).client.certificate_request.context.len = (size_t)puVar50;
      memcpy(puVar26,pvVar18,(size_t)puVar50);
      local_98.base._0_1_ = SUB81(puVar37,0);
      local_98.base._1_1_ = (undefined1)((ulong)puVar37 >> 8);
      local_98.base._2_2_ = (undefined2)((ulong)puVar37 >> 0x10);
      local_98.base._4_1_ = (undefined1)((ulong)puVar37 >> 0x20);
      local_98.base._5_1_ = (undefined1)((ulong)puVar37 >> 0x28);
      local_98.base._6_1_ = (undefined1)((ulong)puVar37 >> 0x30);
      local_98.base._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
      uVar31 = 0x32;
    }
    bVar53 = (uint8_t *)
             CONCAT17(local_98.base._7_1_,
                      CONCAT16(local_98.base._6_1_,
                               CONCAT15(local_98.base._5_1_,
                                        CONCAT14(local_98.base._4_1_,
                                                 CONCAT22(local_98.base._2_2_,
                                                          CONCAT11(local_98.base._1_1_,
                                                                   local_98.base._0_1_)))))) ==
             puVar37;
    uVar30 = 0x32;
    if (bVar53) {
      uVar30 = uVar31;
    }
    if (puVar26 == (uint8_t *)0x0) {
      uVar30 = uVar31;
    }
    bVar53 = puVar26 != (uint8_t *)0x0 && bVar53;
  }
  if (!bVar53) goto LAB_0010ed45;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_a8.len;
  local_a8 = (ptls_iovec_t)(auVar19 << 0x40);
  pVar62 = local_a8;
  local_a8.base._0_2_ = 0x401;
  pVar63 = local_a8;
  local_a8._7_9_ = pVar62._7_9_;
  local_a8.base._0_7_ = 0x8000000000000;
  puVar50 = (uint8_t *)((long)&emitter_00->buf + (long)puVar27);
  local_a8.base._0_6_ = 0x3e0000000000;
  local_a8.base._0_3_ = (uint3)pVar63.base | 0x110000;
  lVar34 = CONCAT17(local_98.base._7_1_,
                    CONCAT16(local_98.base._6_1_,
                             CONCAT15(local_98.base._5_1_,
                                      CONCAT14(local_98.base._4_1_,
                                               CONCAT22(local_98.base._2_2_,
                                                        CONCAT11(local_98.base._1_1_,
                                                                 local_98.base._0_1_))))));
  if ((ulong)((long)puVar50 - lVar34) < 2) {
LAB_0010ed18:
    bVar53 = false;
    uVar30 = 0x32;
  }
  else {
    lVar45 = 0;
    uVar35 = 0;
    do {
      uVar35 = (ulong)*(byte *)(lVar34 + lVar45) | uVar35 << 8;
      lVar45 = lVar45 + 1;
    } while (lVar45 != 2);
    puVar33 = (ushort *)(lVar34 + 2);
    local_98.base._0_1_ = SUB81(puVar33,0);
    local_98.base._1_1_ = (undefined1)((ulong)puVar33 >> 8);
    local_98.base._2_2_ = (undefined2)((ulong)puVar33 >> 0x10);
    local_98.base._4_1_ = (undefined1)((ulong)puVar33 >> 0x20);
    local_98.base._5_1_ = (undefined1)((ulong)puVar33 >> 0x28);
    local_98.base._6_1_ = (undefined1)((ulong)puVar33 >> 0x30);
    local_98.base._7_1_ = (undefined1)((ulong)puVar33 >> 0x38);
    if ((ulong)((long)puVar50 - (long)puVar33) < uVar35) goto LAB_0010ed18;
    if (uVar35 == 0) {
      bVar53 = true;
    }
    else {
      puVar49 = (ushort *)(uVar35 + (long)puVar33);
      uVar31 = 0;
      do {
        uVar30 = 0x32;
        if (1 < (long)puVar49 - (long)puVar33) {
          uVar31 = (uint)(ushort)(*puVar33 << 8 | *puVar33 >> 8);
          puVar40 = puVar33 + 1;
          local_98.base._0_1_ = SUB81(puVar40,0);
          local_98.base._1_1_ = (undefined1)((ulong)puVar40 >> 8);
          local_98.base._2_2_ = (undefined2)((ulong)puVar40 >> 0x10);
          local_98.base._4_1_ = (undefined1)((ulong)puVar40 >> 0x20);
          local_98.base._5_1_ = (undefined1)((ulong)puVar40 >> 0x28);
          local_98.base._6_1_ = (undefined1)((ulong)puVar40 >> 0x30);
          local_98.base._7_1_ = (undefined1)((ulong)puVar40 >> 0x38);
          uVar30 = 0;
        }
        bVar53 = true;
        if ((long)puVar49 - (long)puVar33 < 2) goto LAB_0010f59f;
        uVar22 = (ushort)uVar31;
        if (uVar22 < 0x40) {
          if ((*(byte *)((long)&local_a8.base + (ulong)(uVar31 >> 3)) >> (uVar31 & 7) & 1) != 0) {
            uVar30 = 0x2f;
            goto LAB_0010f59f;
          }
          pbVar1 = (byte *)((long)&local_a8.base + (ulong)(uVar31 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar31 & 7));
        }
        lVar34 = CONCAT17(local_98.base._7_1_,
                          CONCAT16(local_98.base._6_1_,
                                   CONCAT15(local_98.base._5_1_,
                                            CONCAT14(local_98.base._4_1_,
                                                     CONCAT22(local_98.base._2_2_,
                                                              CONCAT11(local_98.base._1_1_,
                                                                       local_98.base._0_1_))))));
        uVar30 = 0x32;
        if ((ulong)((long)puVar49 - lVar34) < 2) {
          bVar52 = false;
        }
        else {
          lVar45 = 0;
          uVar35 = 0;
          do {
            uVar35 = (ulong)*(byte *)(lVar34 + lVar45) | uVar35 << 8;
            lVar45 = lVar45 + 1;
          } while (lVar45 != 2);
          puVar37 = (uint8_t *)(lVar34 + 2);
          local_98.base._0_1_ = SUB81(puVar37,0);
          local_98.base._1_1_ = (undefined1)((ulong)puVar37 >> 8);
          local_98.base._2_2_ = (undefined2)((ulong)puVar37 >> 0x10);
          local_98.base._4_1_ = (undefined1)((ulong)puVar37 >> 0x20);
          local_98.base._5_1_ = (undefined1)((ulong)puVar37 >> 0x28);
          local_98.base._6_1_ = (undefined1)((ulong)puVar37 >> 0x30);
          local_98.base._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
          bVar52 = false;
          if (uVar35 <= (ulong)((long)puVar49 - (long)puVar37)) {
            psVar13 = tls->ctx->on_extension;
            uVar30 = 0;
            if (psVar13 == (st_ptls_on_extension_t *)0x0) {
LAB_0010eee1:
              puVar37 = puVar37 + uVar35;
              uVar41 = uVar30;
              if (uVar22 == 0xd) {
                uVar30 = decode_signature_algorithms
                                   (&(tls->field_18).client.certificate_request.signature_algorithms
                                    ,&local_98.base,puVar37);
                uVar41 = 0;
                if (uVar30 != 0) goto LAB_0010ef0c;
              }
              uVar30 = uVar41;
              local_98.base._0_1_ = SUB81(puVar37,0);
              local_98.base._1_1_ = (undefined1)((ulong)puVar37 >> 8);
              local_98.base._2_2_ = (undefined2)((ulong)puVar37 >> 0x10);
              local_98.base._4_1_ = (undefined1)((ulong)puVar37 >> 0x20);
              local_98.base._5_1_ = (undefined1)((ulong)puVar37 >> 0x28);
              local_98.base._6_1_ = (undefined1)((ulong)puVar37 >> 0x30);
              local_98.base._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
              bVar53 = false;
              bVar52 = true;
            }
            else {
              pVar60.len = uVar35;
              pVar60.base = puVar37;
              iVar23 = (*psVar13->cb)(psVar13,tls,'\r',uVar22,pVar60);
              uVar30 = (uint)(iVar23 != 0);
              if (iVar23 == 0) goto LAB_0010eee1;
LAB_0010ef0c:
              bVar52 = false;
            }
          }
        }
        if (!bVar52) goto LAB_0010f59f;
        puVar33 = (ushort *)
                  CONCAT17(local_98.base._7_1_,
                           CONCAT16(local_98.base._6_1_,
                                    CONCAT15(local_98.base._5_1_,
                                             CONCAT14(local_98.base._4_1_,
                                                      CONCAT22(local_98.base._2_2_,
                                                               CONCAT11(local_98.base._1_1_,
                                                                        local_98.base._0_1_))))));
      } while (puVar33 != puVar49);
      bVar53 = false;
LAB_0010f59f:
      bVar53 = !bVar53;
    }
  }
  if (((bVar53) &&
      (uVar30 = 0x32,
      (uint8_t *)
      CONCAT17(local_98.base._7_1_,
               CONCAT16(local_98.base._6_1_,
                        CONCAT15(local_98.base._5_1_,
                                 CONCAT14(local_98.base._4_1_,
                                          CONCAT22(local_98.base._2_2_,
                                                   CONCAT11(local_98.base._1_1_,local_98.base._0_1_)
                                                  ))))) == puVar50)) &&
     (uVar30 = 0x6d, (tls->field_18).client.certificate_request.signature_algorithms.count != 0)) {
    uVar30 = 0;
  }
LAB_0010ed45:
  if (uVar30 != 0) {
    return uVar30;
  }
  if ((tls->field_18).client.certificate_request.context.len == 0) {
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ppVar8 = tls->key_schedule;
    if (ppVar8->num_hashes != 0) {
      pppVar51 = &ppVar8->hashes[0].ctx;
      sVar48 = 0;
      do {
        (*(*pppVar51)->update)(*pppVar51,emitter_00,(size_t)puVar27);
        sVar48 = sVar48 + 1;
        pppVar51 = pppVar51 + 2;
      } while (sVar48 != ppVar8->num_hashes);
      return 0x202;
    }
    return 0x202;
  }
  return 0x2f;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}